

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-writer.h
# Opt level: O2

void __thiscall
mp::ExprWriter<mp::internal::ExprTypes,_mp::GenericVarNamer>::VisitVariable
          (ExprWriter<mp::internal::ExprTypes,_mp::GenericVarNamer> *this,Variable v)

{
  BasicWriter<char> *this_00;
  int in_EDX;
  string local_30;
  
  this_00 = this->writer_;
  GenericVarNamer::vname_abi_cxx11_
            (&local_30,
             (GenericVarNamer *)
             (ulong)*(uint *)((long)v.super_BasicExpr<(mp::expr::Kind)2,_(mp::expr::Kind)3>.
                                    super_ExprBase.impl_ + 4),in_EDX);
  fmt::BasicWriter<char>::operator<<(this_00,(BasicStringRef<char>)local_30._0_16_);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void VisitVariable(Variable v)
  { writer_ << vnam_.vname(v.index()); }